

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

ptrdiff_t __thiscall pugi::xml_node::offset_debug(xml_node *this)

{
  xml_node_type xVar1;
  xml_document_struct *pxVar2;
  xml_node *in_RDI;
  xml_document_struct *doc;
  long local_38;
  long local_30;
  long local_8;
  
  if (in_RDI->_root == (xml_node_struct *)0x0) {
    return -1;
  }
  pxVar2 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>(in_RDI->_root);
  if ((pxVar2->buffer == (char_t *)0x0) || (pxVar2->extra_buffers != (xml_extra_buffer *)0x0)) {
    return -1;
  }
  xVar1 = type(in_RDI);
  if (xVar1 == node_document) {
    return 0;
  }
  if (xVar1 == node_element) {
LAB_00149fcd:
    if ((in_RDI->_root->name == (char_t *)0x0) || ((in_RDI->_root->header & 0x60) != 0)) {
      local_30 = -1;
    }
    else {
      local_30 = (long)in_RDI->_root->name - (long)pxVar2->buffer;
    }
    local_8 = local_30;
  }
  else {
    if (2 < xVar1 - node_pcdata) {
      if (xVar1 - node_pi < 2) goto LAB_00149fcd;
      if (xVar1 != node_doctype) {
        return -1;
      }
    }
    if ((in_RDI->_root->value == (char_t *)0x0) || ((in_RDI->_root->header & 0x50) != 0)) {
      local_38 = -1;
    }
    else {
      local_38 = (long)in_RDI->_root->value - (long)pxVar2->buffer;
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

PUGI_IMPL_FN ptrdiff_t xml_node::offset_debug() const
	{
		if (!_root) return -1;

		impl::xml_document_struct& doc = impl::get_document(_root);

		// we can determine the offset reliably only if there is exactly once parse buffer
		if (!doc.buffer || doc.extra_buffers) return -1;

		switch (type())
		{
		case node_document:
			return 0;

		case node_element:
		case node_declaration:
		case node_pi:
			return _root->name && (_root->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0 ? _root->name - doc.buffer : -1;

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			return _root->value && (_root->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0 ? _root->value - doc.buffer : -1;

		default:
			assert(false && "Invalid node type"); // unreachable
			return -1;
		}
	}